

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

QString * __thiscall VcprojGenerator::retrievePlatformToolSet(VcprojGenerator *this)

{
  bool bVar1;
  ProKey *in_RSI;
  QStringBuilder<QString,_ProString> *in_RDI;
  long in_FS_OFFSET;
  QByteArray envVar;
  QStringBuilder<QString,_ProString> *this_00;
  QStringBuilder<QString,_ProString> *a;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[0] = -0x56;
  local_20[1] = -0x56;
  local_20[2] = -0x56;
  local_20[3] = -0x56;
  local_20[4] = -0x56;
  local_20[5] = -0x56;
  local_20[6] = -0x56;
  local_20[7] = -0x56;
  local_20[8] = -0x56;
  local_20[9] = -0x56;
  local_20[10] = -0x56;
  local_20[0xb] = -0x56;
  local_20[0xc] = -0x56;
  local_20[0xd] = -0x56;
  local_20[0xe] = -0x56;
  local_20[0xf] = -0x56;
  local_20[0x10] = -0x56;
  local_20[0x11] = -0x56;
  local_20[0x12] = -0x56;
  local_20[0x13] = -0x56;
  local_20[0x14] = -0x56;
  local_20[0x15] = -0x56;
  local_20[0x16] = -0x56;
  local_20[0x17] = -0x56;
  a = in_RDI;
  qgetenv(local_20);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x289e9b);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (size_t)in_RSI);
    this_00 = *(QStringBuilder<QString,_ProString> **)&in_RSI[4].super_ProString.m_offset;
    ProKey::ProKey((ProKey *)in_RDI,(char *)this_00);
    QMakeEvaluator::first
              ((QMakeEvaluator *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_RSI);
    ::operator+(&a->a,(ProString *)in_RDI);
    ::QStringBuilder::operator_cast_to_QString(this_00);
    QStringBuilder<QString,_ProString>::~QStringBuilder(in_RDI);
    ProString::~ProString((ProString *)0x289f4e);
    ProKey::~ProKey((ProKey *)0x289f58);
    QString::~QString((QString *)0x289f65);
  }
  else {
    QString::QString((QString *)in_RSI,(QByteArray *)a);
  }
  QByteArray::~QByteArray((QByteArray *)0x289f7a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &a->a;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::retrievePlatformToolSet() const
{
    // The PlatformToolset string corresponds to the name of a directory in
    // $(VCTargetsPath)\Platforms\{Win32,x64,...}\PlatformToolsets
    // e.g. v90, v100, v110, v110_xp, v120_CTP_Nov, v120, or WindowsSDK7.1

    // This environment variable may be set by a commandline build
    // environment such as the Windows SDK command prompt
    QByteArray envVar = qgetenv("PlatformToolset");
    if (!envVar.isEmpty())
        return envVar;

    return u"v"_s + project->first("MSVC_TOOLSET_VER");
}